

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache_test.cc
# Opt level: O2

void TemplateCacheUnittest::TestStringTemplateInclude(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  char cVar5;
  long lVar6;
  allocator local_1d9;
  string expected;
  string cache_key;
  string cache_key_inc;
  uint7 uStack_167;
  string text_inc;
  string text;
  TemplateCache cache;
  TemplateDictionary dict;
  TemplateString local_68;
  TemplateString local_48;
  TemplateString local_28;
  
  std::__cxx11::string::string((string *)&cache_key,"TestStringTemplateInclude",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&cache_key_inc,"TestStringTemplateInclude-inc",(allocator *)&dict);
  std::__cxx11::string::string((string *)&text,"<html>{{>INC}}</html>",(allocator *)&dict);
  std::__cxx11::string::string
            ((string *)&text_inc,"<div>\n<p>\nUser {{USER}}\n</div>",(allocator *)&dict);
  ctemplate::TemplateCache::TemplateCache(&cache);
  _dict = cache_key._M_dataplus._M_p;
  expected._M_dataplus = text._M_dataplus;
  expected._M_string_length = text._M_string_length;
  expected.field_2._M_local_buf[0] = '\0';
  expected.field_2._8_8_ = 0;
  cVar5 = ctemplate::TemplateCache::StringToTemplateCache
                    ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)&expected);
  if (cVar5 == '\0') {
    printf("ASSERT FAILED, line %d: %s\n",0x3a1,
           "cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP)");
    _dict = cache_key._M_dataplus._M_p;
    expected._M_dataplus = text._M_dataplus;
    expected._M_string_length = text._M_string_length;
    expected.field_2._M_local_buf[0] = '\0';
    expected.field_2._8_8_ = 0;
    cVar5 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)&expected);
    if (cVar5 == '\0') {
      __assert_fail("cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3a1,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
    }
  }
  else {
    _dict = cache_key_inc._M_dataplus._M_p;
    expected._M_dataplus = text_inc._M_dataplus;
    expected._M_string_length = text_inc._M_string_length;
    expected.field_2._M_local_buf[0] = '\0';
    expected.field_2._8_8_ = 0;
    cVar5 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)&expected);
    if (cVar5 != '\0') {
      _dict = cache_key._M_dataplus._M_p;
      lVar6 = ctemplate::TemplateCache::GetTemplate((TemplateString *)&cache,(Strip)&dict);
      if (lVar6 != 0) {
        ctemplate::TemplateString::TemplateString((TemplateString *)&expected,"dict");
        ctemplate::TemplateDictionary::TemplateDictionary
                  (&dict,(TemplateString *)&expected,(UnsafeArena *)0x0);
        ctemplate::TemplateString::TemplateString(&local_28,"INC");
        TVar1.length_ = local_28.length_;
        TVar1.ptr_ = local_28.ptr_;
        TVar1.is_immutable_ = local_28.is_immutable_;
        TVar1._17_7_ = local_28._17_7_;
        TVar1.id_ = local_28.id_;
        ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
        TVar2.length_ = cache_key_inc._M_string_length;
        TVar2.ptr_ = cache_key_inc._M_dataplus._M_p;
        TVar2._16_8_ = (ulong)uStack_167 << 8;
        TVar2.id_ = 0;
        ctemplate::TemplateDictionary::SetFilename(TVar2);
        ctemplate::TemplateString::TemplateString(&local_48,"USER");
        ctemplate::TemplateString::TemplateString(&local_68,"John<>Doe");
        TVar3.length_ = local_48.length_;
        TVar3.ptr_ = local_48.ptr_;
        TVar3.is_immutable_ = local_48.is_immutable_;
        TVar3._17_7_ = local_48._17_7_;
        TVar3.id_ = local_48.id_;
        TVar4.length_ = local_68.length_;
        TVar4.ptr_ = local_68.ptr_;
        TVar4.is_immutable_ = local_68.is_immutable_;
        TVar4._17_7_ = local_68._17_7_;
        TVar4.id_ = local_68.id_;
        ctemplate::TemplateDictionary::SetValue(TVar3,TVar4);
        std::__cxx11::string::string
                  ((string *)&expected,"<html><div>\n<p>\nUser John<>Doe\n</div></html>",&local_1d9)
        ;
        ctemplate::AssertExpandWithCacheIs
                  (&cache,&cache_key,DO_NOT_STRIP,&dict,(PerExpandData *)0x0,&expected,true);
        std::__cxx11::string::~string((string *)&expected);
        ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
        ctemplate::TemplateCache::~TemplateCache(&cache);
        std::__cxx11::string::~string((string *)&text_inc);
        std::__cxx11::string::~string((string *)&text);
        std::__cxx11::string::~string((string *)&cache_key_inc);
        std::__cxx11::string::~string((string *)&cache_key);
        return;
      }
      printf("ASSERT FAILED, line %d: %s\n",0x3a5,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3a5,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
    }
    printf("ASSERT FAILED, line %d: %s\n",0x3a2,
           "cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP)");
    _dict = cache_key_inc._M_dataplus._M_p;
    expected._M_dataplus = text_inc._M_dataplus;
    expected._M_string_length = text_inc._M_string_length;
    expected.field_2._M_local_buf[0] = '\0';
    expected.field_2._8_8_ = 0;
    cVar5 = ctemplate::TemplateCache::StringToTemplateCache
                      ((TemplateString *)&cache,(TemplateString *)&dict,(Strip)&expected);
    if (cVar5 == '\0') {
      __assert_fail("cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_cache_test.cc"
                    ,0x3a2,"static void TemplateCacheUnittest::TestStringTemplateInclude()");
    }
  }
  exit(1);
}

Assistant:

static void TestStringTemplateInclude() {
    const string cache_key = "TestStringTemplateInclude";
    const string cache_key_inc = "TestStringTemplateInclude-inc";
    const string text = "<html>{{>INC}}</html>";
    const string text_inc = "<div>\n<p>\nUser {{USER}}\n</div>";

    TemplateCache cache;
    ASSERT(cache.StringToTemplateCache(cache_key, text, DO_NOT_STRIP));
    ASSERT(cache.StringToTemplateCache(cache_key_inc, text_inc, DO_NOT_STRIP));

    const Template *tpl = cache.GetTemplate(cache_key, DO_NOT_STRIP);
    ASSERT(tpl);

    TemplateDictionary dict("dict");
    TemplateDictionary* sub_dict = dict.AddIncludeDictionary("INC");
    sub_dict->SetFilename(cache_key_inc);

    sub_dict->SetValue("USER", "John<>Doe");
    string expected = "<html><div>\n<p>\nUser John<>Doe\n</div></html>";
    AssertExpandWithCacheIs(&cache, cache_key, DO_NOT_STRIP, &dict, NULL,
                            expected, true);
  }